

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O2

int __thiscall amrex::Box::longside(Box *this,int *dir)

{
  int iVar1;
  int i;
  long lVar2;
  int iVar3;
  
  iVar1 = ((this->bigend).vect[0] - (this->smallend).vect[0]) + 1;
  *dir = 0;
  for (lVar2 = 1; lVar2 != 3; lVar2 = lVar2 + 1) {
    iVar3 = ((this->bigend).vect[lVar2] - (this->smallend).vect[lVar2]) + 1;
    if (iVar1 < iVar3) {
      *dir = (int)lVar2;
      iVar1 = iVar3;
    }
  }
  return iVar1;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    int length (int dir) const noexcept { return bigend[dir] - smallend[dir] + 1; }